

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

Variant * Jinx::operator*(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  bool bVar1;
  ValueType VVar2;
  int64_t iVar3;
  int64_t iVar4;
  double dVar5;
  double dVar6;
  Variant *right_local;
  Variant *left_local;
  Variant *result;
  
  bVar1 = Variant::IsNumericType(left);
  if (bVar1) {
    bVar1 = Variant::IsNumericType(right);
    if (bVar1) {
      VVar2 = Variant::GetType(left);
      if ((VVar2 == Integer) && (VVar2 = Variant::GetType(right), VVar2 == Integer)) {
        Variant::Variant(__return_storage_ptr__);
        iVar3 = Variant::GetInteger(left);
        iVar4 = Variant::GetInteger(right);
        Variant::SetInteger(__return_storage_ptr__,iVar3 * iVar4);
      }
      else {
        Variant::Variant(__return_storage_ptr__);
        dVar5 = Variant::GetNumber(left);
        dVar6 = Variant::GetNumber(right);
        Variant::SetNumber(__return_storage_ptr__,dVar5 * dVar6);
      }
    }
    else {
      Impl::LogWriteLine(Error,"Invalid right operand for multiplication");
      Variant::Variant(__return_storage_ptr__);
    }
  }
  else {
    Impl::LogWriteLine(Error,"Invalid left operand for multiplication");
    Variant::Variant(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator * (const Variant & left, const Variant & right)
	{
		if (!left.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for multiplication");
			return Variant();
		}
		if (!right.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for multiplication");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			result.SetInteger(left.GetInteger() * right.GetInteger());
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() * right.GetNumber());
			return result;
		}
	}